

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCountTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::TextureCountTests::init(TextureCountTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  _Alloc_hider description_00;
  _Alloc_hider name_00;
  char *__s;
  Texture2DRenderCase *this_00;
  allocator<char> local_d9;
  deUint32 local_d8;
  int numTextures;
  long local_d0;
  char *local_c8;
  long local_c0;
  string description;
  string name;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  for (local_d0 = 0; local_d0 != 7; local_d0 = local_d0 + 1) {
    local_d8 = init::texFormats[local_d0].internalFormat;
    local_c8 = init::texFormats[local_d0].name;
    local_c0 = 0;
    while( true ) {
      if (local_c0 == 0x10) break;
      numTextures = *(int *)((long)deqp::gles2::Performance::
                                   addShaderCompilationPerformanceCases(deqp::gles2::TestCaseGroup&)
                                   ::texLookupCounts + local_c0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&description,local_c8,&local_d9);
      std::operator+(&local_58,&description,"_");
      de::toString<int>(&local_78,&numTextures);
      std::operator+(&name,&local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&description);
      __s = glu::getTextureFormatName(local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&description,__s,(allocator<char> *)&local_58);
      this_00 = (Texture2DRenderCase *)operator_new(0x218);
      name_00 = name._M_dataplus;
      description_00 = description._M_dataplus;
      context = (this->super_TestCaseGroup).m_context;
      tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&local_58);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,name_00._M_p,description_00._M_p,local_d8,0x812f,0x812f,0x2600,
                 0x2600,(Mat3 *)&local_58,numTextures,false);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&name);
      local_c0 = local_c0 + 4;
    }
  }
  return 7;
}

Assistant:

void TextureCountTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgb8",		GL_RGB8		},
		{ "rgba8",		GL_RGBA8	},
		{ "rgba8ui",	GL_RGBA8UI	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	},
		{ "rgba32f",	GL_RGBA32F	}
	};
	static const int texCounts[] = { 1, 2, 4, 8 };

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		for (int cntNdx = 0; cntNdx < DE_LENGTH_OF_ARRAY(texCounts); cntNdx++)
		{
			deUint32	format			= texFormats[formatNdx].internalFormat;
			deUint32	wrapS			= GL_CLAMP_TO_EDGE;
			deUint32	wrapT			= GL_CLAMP_TO_EDGE;
			deUint32	minFilter		= GL_NEAREST;
			deUint32	magFilter		= GL_NEAREST;
			int			numTextures		= texCounts[cntNdx];
			string		name			= string(texFormats[formatNdx].name) + "_" + de::toString(numTextures);
			string		description		= glu::getTextureFormatName(format);

			addChild(new Texture2DRenderCase(m_context, name.c_str(), description.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
		}
	}
}